

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestFunkyMakefilePath::Run(GraphTestFunkyMakefilePath *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string err;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule catdep\n  depfile = $out.d\n  command = cat $in > $out\nbuild out.o: catdep foo.cc\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"foo.cc",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    this_00 = &(this->super_GraphTest).fs_;
    VirtualFileSystem::Create(this_00,&err,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"out.o.d",&local_62);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"out.o: ./foo/../implicit.h\n",&local_61);
    VirtualFileSystem::Create(this_00,&err,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"out.o",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&err,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&err);
    piVar1 = &(this->super_GraphTest).fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"implicit.h",&local_62);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
    VirtualFileSystem::Create(this_00,&err,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&err);
    pTVar3 = g_current_test;
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out.o",&local_62);
    pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
    bVar4 = DependencyScan::RecomputeDirty
                      (&(this->super_GraphTest).scan_,pNVar5,
                       (vector<Node_*,_std::allocator<Node_*>_> *)0x0,&err);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x4a,"scan_.RecomputeDirty(GetNode(\"out.o\"), NULL, &err)");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&err);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                       ,0x4b,"\"\" == err");
    pTVar3 = g_current_test;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out.o",&local_62);
      pNVar5 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
      testing::Test::Check
                (pTVar3,pNVar5->dirty_,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                 ,0x4f,"GetNode(\"out.o\")->dirty()");
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, FunkyMakefilePath) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule catdep\n"
"  depfile = $out.d\n"
"  command = cat $in > $out\n"
"build out.o: catdep foo.cc\n"));
  fs_.Create("foo.cc",  "");
  fs_.Create("out.o.d", "out.o: ./foo/../implicit.h\n");
  fs_.Create("out.o", "");
  fs_.Tick();
  fs_.Create("implicit.h", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out.o"), NULL, &err));
  ASSERT_EQ("", err);

  // implicit.h has changed, though our depfile refers to it with a
  // non-canonical path; we should still find it.
  EXPECT_TRUE(GetNode("out.o")->dirty());
}